

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_received(RECEIVED_HANDLE received)

{
  RECEIVED_INSTANCE *received_instance;
  AMQP_VALUE result;
  RECEIVED_HANDLE received_local;
  
  if (received == (RECEIVED_HANDLE)0x0) {
    received_instance = (RECEIVED_INSTANCE *)0x0;
  }
  else {
    received_instance = (RECEIVED_INSTANCE *)amqpvalue_clone(received->composite_value);
  }
  return (AMQP_VALUE)received_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_received(RECEIVED_HANDLE received)
{
    AMQP_VALUE result;

    if (received == NULL)
    {
        result = NULL;
    }
    else
    {
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        result = amqpvalue_clone(received_instance->composite_value);
    }

    return result;
}